

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void create(MATRIX *matrix,bool is_random)

{
  int iVar1;
  time_t tVar2;
  size_type __n;
  reference pvVar3;
  int local_50;
  int j;
  allocator<int> local_3d;
  value_type local_3c;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> fil;
  int i;
  int columnas;
  int filas;
  bool is_random_local;
  MATRIX *matrix_local;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 9;
  for (fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < 9;
      fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    __n = (size_type)
          fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
    local_3c = 0;
    std::allocator<int>::allocator(&local_3d);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_38,__n,&local_3c,&local_3d);
    std::allocator<int>::~allocator(&local_3d);
    if (is_random) {
      for (local_50 = 0;
          local_50 <
          fil.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_; local_50 = local_50 + 1) {
        iVar1 = rand();
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_38,(long)local_50);
        *pvVar3 = iVar1 % 9 + 1;
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(matrix,(value_type *)local_38);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  }
  return;
}

Assistant:

void create(MATRIX &matrix, bool is_random){
    srand(time(nullptr));
    int filas=9, columnas =9;
    for(int i=0;i<filas;i++){
        vector<int> fil = vector<int>(columnas,0);
        if (is_random == true){
            for(int j=0;j<columnas; j++){
                fil[j] = 1+rand()%9;
            }
        }
        matrix.push_back(fil);
    }
}